

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall
ImVector<ImGuiContextHook>::push_back(ImVector<ImGuiContextHook> *this,ImGuiContextHook *v)

{
  ImGuiContextHook *pIVar1;
  ImGuiContextHook *pIVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  int new_capacity;
  
  iVar7 = this->Size;
  if (iVar7 == this->Capacity) {
    if (iVar7 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar7 / 2 + iVar7;
    }
    new_capacity = iVar7 + 1;
    if (iVar7 + 1 < iVar6) {
      new_capacity = iVar6;
    }
    reserve(this,new_capacity);
    iVar7 = this->Size;
  }
  pIVar2 = this->Data;
  uVar3 = *(undefined8 *)v;
  uVar4 = *(undefined8 *)(v + 8);
  uVar5 = *(undefined8 *)(v + 0x18);
  pIVar1 = pIVar2 + (long)iVar7 * 0x20 + 0x10;
  *(undefined8 *)pIVar1 = *(undefined8 *)(v + 0x10);
  *(undefined8 *)(pIVar1 + 8) = uVar5;
  pIVar2 = pIVar2 + (long)iVar7 * 0x20;
  *(undefined8 *)pIVar2 = uVar3;
  *(undefined8 *)(pIVar2 + 8) = uVar4;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }